

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNCallBase::adjust_for_dyn(CTPNCallBase *this,tcpn_dyncomp_info *info)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (info->speculative == 0) {
    iVar1 = (*(this->func_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])();
    this->func_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
    (*(this->arglist_->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0x11])(this->arglist_,info);
    return &this->super_CTcPrsNode;
  }
  err_throw(0x9c5);
}

Assistant:

CTcPrsNode *CTPNCallBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* don't allow in speculative mode because of side effects */
    if (info->speculative)
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* adjust the function expression */
    func_ = func_->adjust_for_dyn(info);
    
    /* adjust the argument list (assume it doesn't change) */
    arglist_->adjust_for_dyn(info);
    
    /* return myself otherwise unchanged */
    return this;
}